

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::to_struct_member
          (CompilerMSL *this,SPIRType *type,uint32_t member_type_id,uint32_t index,string *qualifier
          )

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRType *type_00;
  char *pcVar4;
  CompilerError *pCVar5;
  SPIRType *pSVar6;
  undefined4 in_register_00000014;
  SPIRType *type_01;
  uint32_t index_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  bool local_571;
  bool local_56a;
  byte local_53a;
  undefined1 local_4b8 [32];
  undefined1 local_498 [32];
  undefined1 local_478 [75];
  bool local_42d;
  BuiltIn local_42c;
  string local_428 [3];
  bool is_ib_in_out;
  BuiltIn builtin;
  string array_type;
  allocator local_401;
  string local_400 [36];
  ID local_3dc;
  __cxx11 local_3d8 [32];
  string local_3b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398 [32];
  __cxx11 local_378 [32];
  __cxx11 local_358 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8 [32];
  string local_2d8 [32];
  __cxx11 local_2b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [39];
  allocator local_251;
  string local_250 [8];
  string td_line;
  allocator local_229;
  string local_228 [8];
  string base_type;
  uint local_204;
  uint local_200;
  uint32_t cols;
  uint32_t rows;
  uint32_t local_1d4;
  SPIRType *local_1d0;
  SPIRType *declared_type;
  SPIRType row_major_physical_type;
  bool local_6d;
  bool row_major;
  uint32_t local_5c;
  string local_58 [4];
  uint32_t orig_id;
  string pack_pfx;
  SPIRType *physical_type;
  string *qualifier_local;
  uint32_t index_local;
  uint32_t member_type_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *result;
  
  type_01 = (SPIRType *)CONCAT44(in_register_00000014,member_type_id);
  index_00 = (uint32_t)qualifier;
  bVar1 = CompilerGLSL::member_is_remapped_physical_type((CompilerGLSL *)type,type_01,index_00);
  qualifier_local._4_4_ = index;
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    qualifier_local._4_4_ =
         Compiler::get_extended_member_decoration
                   ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationPhysicalTypeID);
  }
  type_00 = Compiler::get<spirv_cross::SPIRType>((Compiler *)type,qualifier_local._4_4_);
  ::std::__cxx11::string::string(local_58);
  local_5c = 0;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
  bVar1 = Compiler::has_extended_member_decoration
                    ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  if (bVar1) {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    local_5c = Compiler::get_extended_member_decoration
                         ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationInterfaceOrigID);
  }
  local_6d = false;
  bVar1 = Compiler::is_matrix((Compiler *)type,type_00);
  if (bVar1) {
    row_major_physical_type.member_name_cache._M_h._M_single_bucket._4_4_ =
         TypedID::operator_cast_to_TypedID((TypedID *)&(type_01->super_IVariant).self);
    local_6d = Compiler::has_member_decoration
                         ((Compiler *)type,
                          (TypeID)row_major_physical_type.member_name_cache._M_h._M_single_bucket.
                                  _4_4_,index_00,DecorationRowMajor);
  }
  SPIRType::SPIRType((SPIRType *)&declared_type);
  local_1d0 = type_00;
  local_1d4 = (uint32_t)
              TypedID::operator_cast_to_TypedID((TypedID *)&(type_01->super_IVariant).self);
  bVar1 = Compiler::has_member_decoration
                    ((Compiler *)type,(TypeID)local_1d4,index_00,DecorationOffset);
  if (bVar1) {
    *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 1;
  }
  else {
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    bVar1 = Compiler::has_extended_member_decoration
                      ((Compiler *)type,uVar2,index_00,SPIRVCrossDecorationResourceIndexPrimary);
    if (bVar1) {
      *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 1;
    }
  }
  bVar1 = CompilerGLSL::member_is_packed_physical_type((CompilerGLSL *)type,type_01,index_00);
  if (bVar1) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      cols._2_1_ = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)&rows,"Cannot emit a packed struct currently.",
                 (allocator *)((long)&cols + 3));
      CompilerError::CompilerError(pCVar5,(string *)&rows);
      cols._2_1_ = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    bVar1 = Compiler::is_matrix((Compiler *)type,type_00);
    if (bVar1) {
      local_200 = type_00->vecsize;
      local_204 = type_00->columns;
      ::std::__cxx11::string::operator=(local_58,"packed_");
      if (local_6d != false) {
        local_200 = type_00->columns;
        local_204 = type_00->vecsize;
        ::std::__cxx11::string::operator=(local_58,"packed_rm_");
      }
      pcVar4 = "float";
      if (type_00->width == 0x10) {
        pcVar4 = "half";
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_228,pcVar4,&local_229);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_229);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_250,"typedef ",&local_251);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_251);
      ::std::operator+((char *)local_298,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "packed_");
      ::std::__cxx11::to_string(local_2b8,local_200);
      ::std::operator+(local_278,local_298);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_278);
      ::std::__cxx11::string::~string((string *)local_278);
      ::std::__cxx11::string::~string((string *)local_2b8);
      ::std::__cxx11::string::~string((string *)local_298);
      ::std::operator+((char *)local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5eb360
                      );
      ::std::__cxx11::string::operator+=(local_250,local_2d8);
      ::std::__cxx11::string::~string(local_2d8);
      ::std::__cxx11::to_string(local_358,type_00->columns);
      ::std::operator+(local_338,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_228);
      ::std::operator+(local_318,(char *)local_338);
      ::std::__cxx11::to_string(local_378,type_00->vecsize);
      ::std::operator+(local_2f8,local_318);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_2f8);
      ::std::__cxx11::string::~string((string *)local_2f8);
      ::std::__cxx11::string::~string((string *)local_378);
      ::std::__cxx11::string::~string((string *)local_318);
      ::std::__cxx11::string::~string((string *)local_338);
      ::std::__cxx11::string::~string((string *)local_358);
      ::std::__cxx11::to_string(local_3d8,local_204);
      ::std::operator+((char *)local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5ee639
                      );
      ::std::operator+(local_398,(char *)local_3b8);
      ::std::__cxx11::string::operator+=(local_250,(string *)local_398);
      ::std::__cxx11::string::~string((string *)local_398);
      ::std::__cxx11::string::~string(local_3b8);
      ::std::__cxx11::string::~string((string *)local_3d8);
      ::std::__cxx11::string::operator+=(local_250,";");
      add_typedef_line((CompilerMSL *)type,(string *)local_250);
      ::std::__cxx11::string::~string(local_250);
      ::std::__cxx11::string::~string(local_228);
    }
    else {
      bVar1 = Compiler::is_scalar((Compiler *)type,type_00);
      if (!bVar1) {
        ::std::__cxx11::string::operator=(local_58,"packed_");
      }
    }
  }
  else {
    bVar1 = Compiler::is_matrix((Compiler *)type,type_00);
    if (bVar1) {
      bVar1 = Options::supports_msl_version((Options *)&type[0x1d].image.sampled,3,0,0);
      if (!bVar1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
        bVar1 = Compiler::has_extended_decoration
                          ((Compiler *)type,uVar2,SPIRVCrossDecorationWorkgroupStruct);
        if (bVar1) {
          ::std::__cxx11::string::operator=(local_58,"spvStorage_");
          add_spv_func_and_recompile((CompilerMSL *)type,SPVFuncImplStorageMatrix);
          *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 1;
        }
      }
      if (local_6d != false) {
        SPIRType::operator=((SPIRType *)&declared_type,type_00);
        ::std::swap<unsigned_int>
                  ((uint *)&row_major_physical_type.super_IVariant.field_0xc,
                   &row_major_physical_type.width);
        local_1d0 = (SPIRType *)&declared_type;
      }
    }
  }
  local_53a = 0;
  if ((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) &&
     (local_53a = 0, (type_00->image).sampled == 2)) {
    bVar1 = Options::is_ios((Options *)&type[0x1d].image.sampled);
    local_53a = 0;
    if ((bVar1) && (local_53a = 0, (int)type[0x1e].vecsize < 1)) {
      TypedID<(spirv_cross::Types)0>::TypedID(&local_3dc,local_5c);
      bVar1 = Compiler::has_decoration((Compiler *)type,local_3dc,DecorationNonWritable);
      local_53a = bVar1 ^ 0xff;
    }
  }
  if ((local_53a & 1) != 0) {
    pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_400,"Writable images are not allowed on Tier1 argument buffers on iOS.",
               &local_401);
    CompilerError::CompilerError(pCVar5,(string *)local_400);
    __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  ::std::__cxx11::string::string(local_428);
  if (((*(int *)&(type_00->super_IVariant).field_0xc == 0x10) ||
      (*(int *)&(type_00->super_IVariant).field_0xc == 0x12)) ||
     (*(int *)&(type_00->super_IVariant).field_0xc == 0x11)) goto LAB_004d95d7;
  local_42c = BuiltInMax;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&type[0x21].super_IVariant.self);
  if (uVar2 == 0) {
LAB_004d9473:
    uVar2 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)((long)&type[0x21].super_IVariant._vptr_IVariant + 4));
    local_571 = false;
    if (uVar2 != 0) {
      pSVar6 = get_stage_in_struct_type((CompilerMSL *)type);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
      local_571 = false;
      if (uVar2 == uVar3) {
        local_571 = variable_storage_requires_stage_io((CompilerMSL *)type,StorageClassInput);
      }
    }
    local_56a = local_571;
  }
  else {
    pSVar6 = get_stage_out_struct_type((CompilerMSL *)type);
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSVar6->super_IVariant).self);
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_01->super_IVariant).self);
    if (uVar2 != uVar3) goto LAB_004d9473;
    bVar1 = variable_storage_requires_stage_io((CompilerMSL *)type,StorageClassOutput);
    local_56a = true;
    if (!bVar1) goto LAB_004d9473;
  }
  local_42d = local_56a;
  if ((local_56a != false) &&
     (bVar1 = Compiler::is_member_builtin((Compiler *)type,type_01,index_00,&local_42c), bVar1)) {
    *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 1;
  }
  (*(type->super_IVariant)._vptr_IVariant[0x26])(local_478 + 0x28,type,type_00);
  ::std::__cxx11::string::operator=(local_428,(string *)(local_478 + 0x28));
  ::std::__cxx11::string::~string((string *)(local_478 + 0x28));
LAB_004d95d7:
  local_478[0x27] = '\0';
  type_to_glsl_abi_cxx11_((CompilerMSL *)local_478,type,(uint32_t)local_1d0,SUB41(local_5c,0));
  CompilerGLSL::to_member_name_abi_cxx11_((CompilerGLSL *)local_498,type,member_type_id);
  member_attribute_qualifier_abi_cxx11_((CompilerMSL *)local_4b8,type,member_type_id);
  join<std::__cxx11::string&,std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
            ((spirv_cross *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
             (char (*) [2])0x5eb360,in_R9,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_428,
             (char (*) [2])0x5e9b70);
  ::std::__cxx11::string::~string((string *)local_4b8);
  ::std::__cxx11::string::~string((string *)local_498);
  ::std::__cxx11::string::~string((string *)local_478);
  *(undefined1 *)((long)&type[0x21].array.buffer_capacity + 2) = 0;
  local_478[0x27] = '\x01';
  ::std::__cxx11::string::~string(local_428);
  SPIRType::~SPIRType((SPIRType *)&declared_type);
  ::std::__cxx11::string::~string(local_58);
  return this;
}

Assistant:

string CompilerMSL::to_struct_member(const SPIRType &type, uint32_t member_type_id, uint32_t index,
                                     const string &qualifier)
{
	if (member_is_remapped_physical_type(type, index))
		member_type_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &physical_type = get<SPIRType>(member_type_id);

	// If this member is packed, mark it as so.
	string pack_pfx;

	// Allow Metal to use the array<T> template to make arrays a value type
	uint32_t orig_id = 0;
	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID))
		orig_id = get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID);

	bool row_major = false;
	if (is_matrix(physical_type))
		row_major = has_member_decoration(type.self, index, DecorationRowMajor);

	SPIRType row_major_physical_type;
	const SPIRType *declared_type = &physical_type;

	// If a struct is being declared with physical layout,
	// do not use array<T> wrappers.
	// This avoids a lot of complicated cases with packed vectors and matrices,
	// and generally we cannot copy full arrays in and out of buffers into Function
	// address space.
	// Array of resources should also be declared as builtin arrays.
	if (has_member_decoration(type.self, index, DecorationOffset))
		is_using_builtin_array = true;
	else if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
		is_using_builtin_array = true;

	if (member_is_packed_physical_type(type, index))
	{
		// If we're packing a matrix, output an appropriate typedef
		if (physical_type.basetype == SPIRType::Struct)
		{
			SPIRV_CROSS_THROW("Cannot emit a packed struct currently.");
		}
		else if (is_matrix(physical_type))
		{
			uint32_t rows = physical_type.vecsize;
			uint32_t cols = physical_type.columns;
			pack_pfx = "packed_";
			if (row_major)
			{
				// These are stored transposed.
				rows = physical_type.columns;
				cols = physical_type.vecsize;
				pack_pfx = "packed_rm_";
			}
			string base_type = physical_type.width == 16 ? "half" : "float";
			string td_line = "typedef ";
			td_line += "packed_" + base_type + to_string(rows);
			td_line += " " + pack_pfx;
			// Use the actual matrix size here.
			td_line += base_type + to_string(physical_type.columns) + "x" + to_string(physical_type.vecsize);
			td_line += "[" + to_string(cols) + "]";
			td_line += ";";
			add_typedef_line(td_line);
		}
		else if (!is_scalar(physical_type)) // scalar type is already packed.
			pack_pfx = "packed_";
	}
	else if (is_matrix(physical_type))
	{
		if (!msl_options.supports_msl_version(3, 0) &&
		    has_extended_decoration(type.self, SPIRVCrossDecorationWorkgroupStruct))
		{
			pack_pfx = "spvStorage_";
			add_spv_func_and_recompile(SPVFuncImplStorageMatrix);
			// The pack prefix causes problems with array<T> wrappers.
			is_using_builtin_array = true;
		}
		if (row_major)
		{
			// Need to declare type with flipped vecsize/columns.
			row_major_physical_type = physical_type;
			swap(row_major_physical_type.vecsize, row_major_physical_type.columns);
			declared_type = &row_major_physical_type;
		}
	}

	// iOS Tier 1 argument buffers do not support writable images.
	if (physical_type.basetype == SPIRType::Image &&
		physical_type.image.sampled == 2 &&
		msl_options.is_ios() &&
		msl_options.argument_buffers_tier <= Options::ArgumentBuffersTier::Tier1 &&
		!has_decoration(orig_id, DecorationNonWritable))
	{
		SPIRV_CROSS_THROW("Writable images are not allowed on Tier1 argument buffers on iOS.");
	}

	// Array information is baked into these types.
	string array_type;
	if (physical_type.basetype != SPIRType::Image && physical_type.basetype != SPIRType::Sampler &&
	    physical_type.basetype != SPIRType::SampledImage)
	{
		BuiltIn builtin = BuiltInMax;

		// Special handling. In [[stage_out]] or [[stage_in]] blocks,
		// we need flat arrays, but if we're somehow declaring gl_PerVertex for constant array reasons, we want
		// template array types to be declared.
		bool is_ib_in_out =
				((stage_out_var_id && get_stage_out_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassOutput)) ||
				 (stage_in_var_id && get_stage_in_struct_type().self == type.self &&
				  variable_storage_requires_stage_io(StorageClassInput)));
		if (is_ib_in_out && is_member_builtin(type, index, &builtin))
			is_using_builtin_array = true;
		array_type = type_to_array_glsl(physical_type);
	}

	auto result = join(pack_pfx, type_to_glsl(*declared_type, orig_id, true), " ", qualifier,
	                   to_member_name(type, index), member_attribute_qualifier(type, index), array_type, ";");

	is_using_builtin_array = false;
	return result;
}